

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

Abc_Cex_t * Saig_BmcGenerateCounterExample(Saig_Bmc_t *p)

{
  uint uVar1;
  Abc_Cex_t *p_00;
  Aig_Obj_t *pAVar2;
  int iVar3;
  int i;
  int iVar4;
  
  p_00 = Abc_CexAlloc(p->pAig->nRegs,p->pAig->nTruePis,p->iFrameFail + 1);
  iVar4 = p->iFrameFail;
  p_00->iFrame = iVar4;
  p_00->iPo = p->iOutputFail;
  i = 0;
  do {
    if (iVar4 < i) {
      iVar4 = Saig_ManVerifyCex(p->pAig,p_00);
      if (iVar4 == 0) {
        puts("Saig_BmcGenerateCounterExample(): Counter-example is invalid.");
        Abc_CexFree(p_00);
        p_00 = (Abc_Cex_t *)0x0;
      }
      return p_00;
    }
    for (iVar4 = 0; iVar4 < p->pAig->nTruePis; iVar4 = iVar4 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,iVar4);
      pAVar2 = Saig_BmcObjFrame(p,pAVar2,i);
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        uVar1 = Saig_BmcSatNum(p,pAVar2);
        if (uVar1 != 0) {
          if (((int)uVar1 < 0) || (p->pSat->size <= (int)uVar1)) {
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                          ,0xd0,"int sat_solver_var_value(sat_solver *, int)");
          }
          if (p->pSat->model[uVar1] == 1) {
            iVar3 = p->pAig->nTruePis * i + p_00->nRegs + iVar4;
            (&p_00[1].iPo)[iVar3 >> 5] = (&p_00[1].iPo)[iVar3 >> 5] | 1 << ((byte)iVar3 & 0x1f);
          }
        }
      }
    }
    i = i + 1;
    iVar4 = p->iFrameFail;
  } while( true );
}

Assistant:

Abc_Cex_t * Saig_BmcGenerateCounterExample( Saig_Bmc_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj, * pObjFrm;
    int i, f, iVarNum;
    // start the counter-example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), p->iFrameFail+1 );
    pCex->iFrame = p->iFrameFail;
    pCex->iPo    = p->iOutputFail;
    // copy the bit data
    for ( f = 0; f <= p->iFrameFail; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjFrm = Saig_BmcObjFrame( p, pObj, f );
            if ( pObjFrm == NULL )
                continue;
            iVarNum = Saig_BmcSatNum( p, pObjFrm );
            if ( iVarNum == 0 )
                continue;
            if ( sat_solver_var_value( p->pSat, iVarNum ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + Saig_ManPiNum(p->pAig) * f + i );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p->pAig, pCex ) )
    {
        printf( "Saig_BmcGenerateCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;
}